

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O1

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::LinearFunctionalConstraint>
::Container::Container(Container *this,int d,LinearFunctionalConstraint *c)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  LinearFunctionalConstraint local_d0;
  
  paVar2 = &local_d0.super_FunctionalConstraint.super_BasicConstraint.name_.field_2;
  local_d0.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
       (c->super_FunctionalConstraint).super_BasicConstraint.name_._M_dataplus._M_p;
  paVar1 = &(c->super_FunctionalConstraint).super_BasicConstraint.name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p == paVar1)
  {
    local_d0.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._M_allocated_capacity =
         paVar1->_M_allocated_capacity;
    local_d0.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._8_8_ =
         *(undefined8 *)
          ((long)&(c->super_FunctionalConstraint).super_BasicConstraint.name_.field_2 + 8);
    local_d0.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
         (pointer)paVar2;
  }
  else {
    local_d0.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._M_allocated_capacity =
         paVar1->_M_allocated_capacity;
  }
  local_d0.super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length =
       (c->super_FunctionalConstraint).super_BasicConstraint.name_._M_string_length;
  (c->super_FunctionalConstraint).super_BasicConstraint.name_._M_dataplus._M_p = (pointer)paVar1;
  (c->super_FunctionalConstraint).super_BasicConstraint.name_._M_string_length = 0;
  (c->super_FunctionalConstraint).super_BasicConstraint.name_.field_2._M_local_buf[0] = '\0';
  local_d0.super_FunctionalConstraint.result_var_ = (c->super_FunctionalConstraint).result_var_;
  local_d0.super_FunctionalConstraint.ctx.value_ = (c->super_FunctionalConstraint).ctx.value_;
  local_d0.affine_expr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
  m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
       (c->affine_expr_).super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
       m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
  if (local_d0.affine_expr_.super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
    local_d0.affine_expr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
    m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_d0.affine_expr_.super_LinTerms.coefs_.
                      super_small_vector_base<std::allocator<double>,_6U>.m_data + 0x18);
    local_d0.affine_expr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
    m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    local_d0.affine_expr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
    m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_size =
         (c->affine_expr_).super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>
         .m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_size;
    if (local_d0.affine_expr_.super_LinTerms.coefs_.
        super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
      memcpy(local_d0.affine_expr_.super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             (c->affine_expr_).super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
             local_d0.affine_expr_.super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
    }
  }
  else {
    local_d0.affine_expr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
    m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (c->affine_expr_).super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>
         .m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
    local_d0.affine_expr_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
    m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_size =
         (c->affine_expr_).super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>
         .m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_size;
    (c->affine_expr_).super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
    m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
    (c->affine_expr_).super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
    m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
         (ptr)&(c->affine_expr_).super_LinTerms.coefs_.
               super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage;
    (c->affine_expr_).super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
    m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  }
  local_d0.affine_expr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data
  .super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
       (c->affine_expr_).super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
       m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
  if (local_d0.affine_expr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
      m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
    local_d0.affine_expr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)((long)&local_d0.affine_expr_.super_LinTerms.vars_.
                      super_small_vector_base<std::allocator<int>,_6U>.m_data + 0x18);
    local_d0.affine_expr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    local_d0.affine_expr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_size =
         (c->affine_expr_).super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
         m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_size;
    if (local_d0.affine_expr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
        m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
      memcpy(local_d0.affine_expr_.super_LinTerms.vars_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             (c->affine_expr_).super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>
             .m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
             local_d0.affine_expr_.super_LinTerms.vars_.
             super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
    }
  }
  else {
    local_d0.affine_expr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (c->affine_expr_).super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
         m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    local_d0.affine_expr_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_size =
         (c->affine_expr_).super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
         m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_size;
    (c->affine_expr_).super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
    (c->affine_expr_).super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
         (ptr)&(c->affine_expr_).super_LinTerms.vars_.
               super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage;
    (c->affine_expr_).super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
    super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  }
  local_d0.affine_expr_.constant_term_ = (c->affine_expr_).constant_term_;
  ExprWrapper<mp::LinearFunctionalConstraint>::ExprWrapper(&this->con_,&local_d0);
  if (6 < local_d0.affine_expr_.super_LinTerms.vars_.
          super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_d0.affine_expr_.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_d0.affine_expr_.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_d0.affine_expr_.super_LinTerms.coefs_.
          super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_d0.affine_expr_.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_d0.affine_expr_.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p != paVar2)
  {
    operator_delete(local_d0.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p
                    ,local_d0.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
                     _M_allocated_capacity + 1);
  }
  this->depth_ = d;
  (this->ctx_redef_).value_ = CTX_NONE;
  *(undefined4 *)((long)&(this->ctx_redef_).value_ + 3) = 0;
  return;
}

Assistant:

Container(int d, Constraint&& c) noexcept
      : con_(std::move(c)), depth_(d) { }